

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  Fl_Menu_Item *this_00;
  int iVar1;
  long lVar2;
  
  this_00 = this->menu_;
  if (this_00 == (Fl_Menu_Item *)0x0) {
    lVar2 = 0;
  }
  else {
    iVar1 = Fl_Menu_Item::size(this_00);
    lVar2 = (long)iVar1;
  }
  iVar1 = -1;
  if ((this->menu_ <= item) && (item < this_00 + lVar2)) {
    iVar1 = (int)((ulong)((long)item - (long)this->menu_) >> 3) * -0x49249249;
  }
  return iVar1;
}

Assistant:

int Fl_Menu_::find_index(const Fl_Menu_Item *item) const {
  Fl_Menu_Item *max = menu_+size();
  if (item<menu_ || item>=max) return(-1);
  return (int) (item-menu_);
}